

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneBspTreeIndex::itemChange
          (QGraphicsSceneBspTreeIndex *this,QGraphicsItem *item,GraphicsItemChange change,
          void *value)

{
  Int IVar1;
  QFlagsStorage<QGraphicsItem::GraphicsItemFlag> QVar2;
  QGraphicsSceneBspTreeIndexPrivate *this_00;
  QGraphicsItemPrivate *pQVar3;
  undefined4 *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_FS_OFFSET;
  undefined1 recursive;
  undefined1 moveToUnindexedItems;
  bool bVar4;
  bool bVar5;
  QGraphicsItem *thatItem_1;
  bool ancestorWillClipChildren;
  bool ancestorClippedChildren;
  bool willIgnoreTransform_1;
  bool ignoredTransform_1;
  QGraphicsItem *newParent;
  QGraphicsItem *thatItem;
  bool willClipChildren;
  bool clipsChildren;
  bool willIgnoreTransform;
  bool ignoredTransform;
  QGraphicsSceneBspTreeIndexPrivate *d;
  GraphicsItemFlags newFlags;
  GraphicsItemFlag in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff91;
  undefined1 in_stack_ffffffffffffff92;
  bool bVar6;
  undefined1 in_stack_ffffffffffffff93;
  bool bVar7;
  undefined1 uVar8;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  QFlagsStorage<QGraphicsItem::GraphicsItemFlag> in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGraphicsSceneBspTreeIndex *)0xa1f933);
  if (in_EDX == 5) {
    QGraphicsSceneBspTreeIndexPrivate::invalidateSortCache
              ((QGraphicsSceneBspTreeIndexPrivate *)
               CONCAT44(5,CONCAT13(in_stack_ffffffffffffff93,
                                   CONCAT12(in_stack_ffffffffffffff92,
                                            CONCAT11(in_stack_ffffffffffffff91,
                                                     in_stack_ffffffffffffff90)))));
    pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RSI + 8));
    bVar7 = QGraphicsItemPrivate::itemIsUntransformable(pQVar3);
    pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RSI + 8));
    bVar6 = true;
    if (((*(ulong *)&pQVar3->field_0x160 & 0x2000000000) == 0) &&
       (bVar6 = false, in_RCX != (undefined4 *)0x0)) {
      pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)(in_RCX + 2));
      bVar6 = QGraphicsItemPrivate::itemIsUntransformable(pQVar3);
    }
    pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RSI + 8));
    bVar4 = true;
    if ((*(ulong *)&pQVar3->field_0x160 & 0x20000) == 0) {
      pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)(in_RSI + 8));
      bVar4 = (*(ulong *)&pQVar3->field_0x160 & 0x100000) != 0;
    }
    bVar5 = false;
    if (in_RCX != (undefined4 *)0x0) {
      pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)(in_RCX + 2));
      bVar5 = true;
      if ((*(ulong *)&pQVar3->field_0x160 & 0x1000000000) == 0) {
        pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                               *)(in_RCX + 2));
        bVar5 = true;
        if ((*(ulong *)&pQVar3->field_0x160 & 0x8000000000000) == 0) {
          pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                 *)(in_RCX + 2));
          bVar5 = true;
          if ((*(ulong *)&pQVar3->field_0x160 & 0x20000) == 0) {
            pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                     ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                   *)(in_RCX + 2));
            bVar5 = (*(ulong *)&pQVar3->field_0x160 & 0x100000) != 0;
          }
        }
      }
    }
    if ((bVar7 != bVar6) || (bVar4 != bVar5)) {
      QGraphicsSceneBspTreeIndexPrivate::removeItem
                (this_00,(QGraphicsItem *)
                         CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8.i),
                 (bool)in_stack_ffffffffffffffbf,(bool)in_stack_ffffffffffffffbe);
    }
  }
  else if (in_EDX == 0x15) {
    local_c = *in_RCX;
    pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RSI + 8));
    recursive = (*(ulong *)&pQVar3->field_0x160 & 0x2000000000) != 0;
    local_10.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
         (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
         QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                   ((QFlags<QGraphicsItem::GraphicsItemFlag> *)
                    CONCAT44(in_EDX,CONCAT13(in_stack_ffffffffffffff93,
                                             CONCAT12(in_stack_ffffffffffffff92,
                                                      CONCAT11(in_stack_ffffffffffffff91,
                                                               in_stack_ffffffffffffff90)))),
                    in_stack_ffffffffffffff8c);
    IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
    moveToUnindexedItems = IVar1 != 0;
    pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RSI + 8));
    bVar7 = true;
    if ((*(ulong *)&pQVar3->field_0x160 & 0x1000000000) == 0) {
      pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)(in_RSI + 8));
      bVar7 = (*(ulong *)&pQVar3->field_0x160 & 0x8000000000000) != 0;
    }
    uVar8 = bVar7;
    QVar2.i = (Int)QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                             ((QFlags<QGraphicsItem::GraphicsItemFlag> *)
                              CONCAT44(in_EDX,CONCAT13(bVar7,CONCAT12(in_stack_ffffffffffffff92,
                                                                      CONCAT11(
                                                  in_stack_ffffffffffffff91,
                                                  in_stack_ffffffffffffff90)))),
                              in_stack_ffffffffffffff8c);
    IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffec);
    bVar6 = true;
    if (IVar1 == 0) {
      in_stack_ffffffffffffffe8.i =
           (Int)QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                          ((QFlags<QGraphicsItem::GraphicsItemFlag> *)
                           CONCAT44(in_EDX,CONCAT13(uVar8,CONCAT12(1,CONCAT11(
                                                  in_stack_ffffffffffffff91,
                                                  in_stack_ffffffffffffff90)))),
                           in_stack_ffffffffffffff8c);
      IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffe8);
      bVar6 = IVar1 != 0;
    }
    if (((recursive & 1) != (moveToUnindexedItems & 1)) || (bVar7 != bVar6)) {
      QGraphicsSceneBspTreeIndexPrivate::removeItem
                (this_00,(QGraphicsItem *)CONCAT44(QVar2.i,in_stack_ffffffffffffffe8.i),
                 (bool)recursive,(bool)moveToUnindexedItems);
    }
  }
  else if (in_EDX == 0x17) {
    QGraphicsSceneBspTreeIndexPrivate::invalidateSortCache
              ((QGraphicsSceneBspTreeIndexPrivate *)
               CONCAT44(0x17,CONCAT13(in_stack_ffffffffffffff93,
                                      CONCAT12(in_stack_ffffffffffffff92,
                                               CONCAT11(in_stack_ffffffffffffff91,
                                                        in_stack_ffffffffffffff90)))));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsSceneBspTreeIndex::itemChange(const QGraphicsItem *item, QGraphicsItem::GraphicsItemChange change, const void *const value)
{
    Q_D(QGraphicsSceneBspTreeIndex);
    switch (change) {
    case QGraphicsItem::ItemFlagsChange: {
        // Handle ItemIgnoresTransformations
        QGraphicsItem::GraphicsItemFlags newFlags = *static_cast<const QGraphicsItem::GraphicsItemFlags *>(value);
        bool ignoredTransform = item->d_ptr->flags & QGraphicsItem::ItemIgnoresTransformations;
        bool willIgnoreTransform = newFlags & QGraphicsItem::ItemIgnoresTransformations;
        bool clipsChildren = item->d_ptr->flags & QGraphicsItem::ItemClipsChildrenToShape
                             || item->d_ptr->flags & QGraphicsItem::ItemContainsChildrenInShape;
        bool willClipChildren = newFlags & QGraphicsItem::ItemClipsChildrenToShape
                                || newFlags & QGraphicsItem::ItemContainsChildrenInShape;
        if ((ignoredTransform != willIgnoreTransform) || (clipsChildren != willClipChildren)) {
            QGraphicsItem *thatItem = const_cast<QGraphicsItem *>(item);
            // Remove item and its descendants from the index and append
            // them to the list of unindexed items. Then, when the index
            // is updated, they will be put into the bsp-tree or the list
            // of untransformable items.
            d->removeItem(thatItem, /*recursive=*/true, /*moveToUnidexedItems=*/true);
        }
        break;
    }
    case QGraphicsItem::ItemZValueChange:
        d->invalidateSortCache();
        break;
    case QGraphicsItem::ItemParentChange: {
        d->invalidateSortCache();
        // Handle ItemIgnoresTransformations
        const QGraphicsItem *newParent = static_cast<const QGraphicsItem *>(value);
        bool ignoredTransform = item->d_ptr->itemIsUntransformable();
        bool willIgnoreTransform = (item->d_ptr->flags & QGraphicsItem::ItemIgnoresTransformations)
                                   || (newParent && newParent->d_ptr->itemIsUntransformable());
        bool ancestorClippedChildren = item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren
                                       || item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorContainsChildren;
        bool ancestorWillClipChildren = newParent
                            && ((newParent->d_ptr->flags & QGraphicsItem::ItemClipsChildrenToShape
                                 || newParent->d_ptr->flags & QGraphicsItem::ItemContainsChildrenInShape)
                                || (newParent->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren
                                    || newParent->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorContainsChildren));
        if ((ignoredTransform != willIgnoreTransform) || (ancestorClippedChildren != ancestorWillClipChildren)) {
            QGraphicsItem *thatItem = const_cast<QGraphicsItem *>(item);
            // Remove item and its descendants from the index and append
            // them to the list of unindexed items. Then, when the index
            // is updated, they will be put into the bsp-tree or the list
            // of untransformable items.
            d->removeItem(thatItem, /*recursive=*/true, /*moveToUnidexedItems=*/true);
        }
        break;
    }
    default:
        break;
    }
}